

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int subjournalPageIfRequired(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPager;
  sqlite3_file *psVar2;
  sqlite3_vfs *psVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  bool bVar11;
  uint local_34;
  
  pPager = pPg->pPager;
  iVar6 = pPager->nSavepoint;
  lVar8 = (long)iVar6;
  if (0 < lVar8) {
    uVar1 = pPg->pgno;
    piVar9 = &pPager->aSavepoint[1].bTruncateOnRelease;
    lVar10 = 1;
    do {
      if ((uVar1 <= (uint)piVar9[-0x10]) &&
         (iVar5 = sqlite3BitvecTestNotNull(*(Bitvec **)(piVar9 + -0x12),uVar1), iVar5 == 0)) {
        if ((int)lVar10 < iVar6) {
          do {
            *piVar9 = 0;
            lVar8 = lVar8 + -1;
            piVar9 = piVar9 + 0xe;
          } while (lVar10 != lVar8);
        }
        iVar6 = 0;
        if (pPager->journalMode != '\x02') {
          psVar2 = pPager->sjfd;
          iVar6 = 0;
          if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
            if ((pPager->journalMode == '\x04') ||
               (iVar5 = sqlite3Config.nStmtSpill, pPager->subjInMemory != '\0')) {
              iVar5 = -1;
            }
            psVar3 = pPager->pVfs;
            psVar2[8].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[9].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[6].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[7].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar2->pMethods = (sqlite3_io_methods *)0x0;
            psVar2[1].pMethods = (sqlite3_io_methods *)0x0;
            if (iVar5 == 0) {
              iVar6 = (*psVar3->xOpen)((sqlite3_file *)psVar3,0);
            }
            else {
              iVar7 = 0x3f8;
              if (0 < iVar5) {
                iVar7 = iVar5;
              }
              *(int *)&psVar2[1].pMethods = iVar7;
              psVar2->pMethods = &MemJournalMethods;
              *(int *)((long)&psVar2[1].pMethods + 4) = iVar5;
              *(undefined4 *)&psVar2[7].pMethods = 0x201e;
              psVar2[9].pMethods = (sqlite3_io_methods *)0x0;
              psVar2[8].pMethods = (sqlite3_io_methods *)psVar3;
            }
          }
          if (iVar6 == 0) {
            pvVar4 = pPg->pData;
            lVar8 = (pPager->pageSize + 4) * (ulong)pPager->nSubRec;
            uVar1 = pPg->pgno;
            local_34 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18;
            iVar6 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,&local_34,4,lVar8);
            if (iVar6 == 0) {
              iVar6 = (*pPager->sjfd->pMethods->xWrite)
                                (pPager->sjfd,pvVar4,(int)pPager->pageSize,lVar8 + 4);
            }
          }
        }
        if (iVar6 != 0) {
          return iVar6;
        }
        pPager->nSubRec = pPager->nSubRec + 1;
        iVar6 = addToSavepointBitvecs(pPager,pPg->pgno);
        return iVar6;
      }
      piVar9 = piVar9 + 0xe;
      bVar11 = lVar10 != lVar8;
      lVar10 = lVar10 + 1;
    } while (bVar11);
  }
  return 0;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  PagerSavepoint *p;
  Pgno pgno = pPg->pgno;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTestNotNull(p->pInSavepoint, pgno) ){
      for(i=i+1; i<pPager->nSavepoint; i++){
        pPager->aSavepoint[i].bTruncateOnRelease = 0;
      }
      return 1;
    }
  }
  return 0;
}